

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_floor.cpp
# Opt level: O2

int AF_DFloor_CreateFloor
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  VMValue *pVVar2;
  VMValue *pVVar3;
  int iVar4;
  sector_t_conflict *sec;
  char *pcVar5;
  int change;
  bool bVar6;
  void *height;
  
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
LAB_004040d9:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                  ,0x1f2,
                  "int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if ((param->field_0).field_3.Type != '\x03') {
    pcVar5 = "param[paramnum].Type == REGT_POINTER";
    goto LAB_004040d9;
  }
  sec = (sector_t_conflict *)(param->field_0).field_1.a;
  if (sec == (sector_t_conflict *)0x0) {
    NullParam("\"sec\"");
    sec = (sector_t_conflict *)(param->field_0).field_1.a;
  }
  if (numparam == 1) {
    pcVar5 = "(paramnum) < numparam";
LAB_00404101:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                  ,499,
                  "int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\0') {
    pcVar5 = "param[paramnum].Type == REGT_INT";
    goto LAB_00404101;
  }
  if ((uint)numparam < 3) {
    pcVar5 = "(paramnum) < numparam";
LAB_00404129:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                  ,500,
                  "int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[2].field_0.field_3.Type != '\x03') {
    pcVar5 = "param[paramnum].Type == REGT_POINTER";
    goto LAB_00404129;
  }
  if (numparam == 3) {
    pcVar5 = "(paramnum) < numparam";
LAB_00404151:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                  ,0x1f5,
                  "int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[3].field_0.field_3.Type != '\x01') {
    pcVar5 = "param[paramnum].Type == REGT_FLOAT";
    goto LAB_00404151;
  }
  pVVar1 = param + 1;
  pVVar2 = param + 2;
  pVVar3 = param + 3;
  if ((uint)numparam < 5) {
    param = defaultparam->Array;
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_004041fe;
    }
    height = param[4].field_0.field_1.a;
LAB_00403fcf:
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_0040421d:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                    ,0x1f7,
                    "int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
      ;
    }
    iVar4 = param[5].field_0.i;
LAB_00403fde:
    if (param[6].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_004041ae:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                    ,0x1f8,
                    "int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
      ;
    }
    change = param[6].field_0.i;
LAB_00403fed:
    if (param[7].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_0040418f:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                    ,0x1f9,
                    "int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
      ;
    }
    bVar6 = param[7].field_0.i != 0;
  }
  else {
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar5 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_004041fe:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                    ,0x1f6,
                    "int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
      ;
    }
    height = (void *)param[4].field_0.f;
    if (numparam == 5) {
      param = defaultparam->Array;
      goto LAB_00403fcf;
    }
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_0040421d;
    }
    iVar4 = param[5].field_0.i;
    if ((uint)numparam < 7) {
      param = defaultparam->Array;
      goto LAB_00403fde;
    }
    if (param[6].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_004041ae;
    }
    change = param[6].field_0.i;
    if (numparam == 7) {
      param = defaultparam->Array;
      goto LAB_00403fed;
    }
    if (param[7].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_0040418f;
    }
    bVar6 = param[7].field_0.i != 0;
    if (8 < (uint)numparam) {
      if (param[8].field_0.field_3.Type != '\0') {
        pcVar5 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_00404170;
      }
      goto LAB_0040400e;
    }
    param = defaultparam->Array;
  }
  if (param[8].field_0.field_3.Type != '\0') {
    pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_00404170:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                  ,0x1fa,
                  "int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_0040400e:
  bVar6 = P_CreateFloor(sec,(pVVar1->field_0).i,(line_t_conflict *)(pVVar2->field_0).field_1.a,
                        (pVVar3->field_0).f,(double)height,iVar4,change,param[8].field_0.i != 0,
                        bVar6);
  if (numret < 1) {
    iVar4 = 0;
  }
  else {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                    ,0x1fb,
                    "int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
      ;
    }
    VMReturn::SetInt(ret,(uint)bVar6);
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

DEFINE_ACTION_FUNCTION(DFloor, CreateFloor)
{
	PARAM_PROLOGUE;
	PARAM_POINTER_NOT_NULL(sec, sector_t);
	PARAM_INT(floortype);
	PARAM_POINTER(ln, line_t);
	PARAM_FLOAT(speed);
	PARAM_FLOAT_DEF(height);
	PARAM_INT_DEF(crush);
	PARAM_INT_DEF(change);
	PARAM_BOOL_DEF(hereticlower);
	PARAM_BOOL_DEF(hexencrush);
	ACTION_RETURN_BOOL(P_CreateFloor(sec, (DFloor::EFloor)floortype, ln, speed, height, crush, change, hexencrush, hereticlower));
}